

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ValueHolder VVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  ValueHolder *pVVar4;
  ushort uVar5;
  Token *tokenStart;
  Token token;
  ValueHolder local_50;
  ushort local_48;
  long local_40 [2];
  Token local_30;
  
  do {
    tokenStart = &local_30;
    readToken(this,&local_30);
  } while (local_30.type_ == tokenComment);
  switch(local_30.type_) {
  case tokenObjectBegin:
    bVar2 = readObject(this,tokenStart);
    return bVar2;
  default:
    local_50.string_ = (char *)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Syntax error: value, object or array expected.","");
    addError(this,(string *)&local_50,&local_30,(Location)0x0);
    if (local_50 != local_40) {
      operator_delete(local_50.string_,local_40[0] + 1);
    }
    bVar2 = false;
    break;
  case tokenArrayBegin:
    bVar2 = readArray(this,tokenStart);
    return bVar2;
  case tokenString:
    bVar2 = decodeString(this,&local_30);
    break;
  case tokenInteger:
    bVar2 = decodeNumber(this,&local_30);
    break;
  case tokenDouble:
    bVar2 = decodeDouble(this,&local_30);
    break;
  case tokenTrue:
    local_50.bool_ = true;
    goto LAB_001c3ed3;
  case tokenFalse:
    local_50.string_ = (char *)((ulong)(uint7)local_50._1_7_ << 8);
LAB_001c3ed3:
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar4 = &ppVVar3[-1]->value_;
    VVar1.string_ = *(char **)pVVar4;
    pVVar4->string_ = (char *)local_50;
    local_48 = *(ushort *)(pVVar4 + 1);
    uVar5 = local_48 & 0xfe00 | 5;
    local_50.string_ = VVar1.string_;
LAB_001c3f10:
    *(ushort *)(pVVar4 + 1) = uVar5;
    local_48 = local_48 & 0x1ff;
    Value::~Value((Value *)&local_50);
    bVar2 = true;
    break;
  case tokenNull:
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar4 = &ppVVar3[-1]->value_;
    local_48 = *(ushort *)(pVVar4 + 1);
    uVar5 = local_48 & 0xfe00;
    local_50 = *pVVar4;
    goto LAB_001c3f10;
  }
  return bVar2;
}

Assistant:

bool
Reader::readValue ()
{
    Token token;
    skipCommentTokens ( token );
    bool successful = true;

    switch ( token.type_ )
    {
    case tokenObjectBegin:
        successful = readObject ( token );
        break;

    case tokenArrayBegin:
        successful = readArray ( token );
        break;

    case tokenInteger:
        successful = decodeNumber ( token );
        break;

    case tokenDouble:
        successful = decodeDouble ( token );
        break;

    case tokenString:
        successful = decodeString ( token );
        break;

    case tokenTrue:
        currentValue () = true;
        break;

    case tokenFalse:
        currentValue () = false;
        break;

    case tokenNull:
        currentValue () = Value ();
        break;

    default:
        return addError ( "Syntax error: value, object or array expected.", token );
    }

    return successful;
}